

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

genxStatus checkNCName(genxWriter w,constUtf8 name)

{
  int iVar1;
  int iVar2;
  constUtf8 in_RSI;
  genxWriter in_RDI;
  int c;
  constUtf8 local_18;
  genxWriter local_10;
  
  if ((in_RSI != (constUtf8)0x0) && (*in_RSI != '\0')) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar1 = genxNextUnicodeChar(&local_18);
    iVar2 = isLetter(local_10,iVar1);
    if ((iVar2 != 0) || ((iVar1 == 0x3a || (iVar1 == 0x5f)))) {
      do {
        if (*local_18 == '\0') {
          return GENX_SUCCESS;
        }
        iVar1 = genxNextUnicodeChar(&local_18);
        if (iVar1 == -1) {
          return GENX_BAD_UTF8;
        }
        iVar1 = isNameChar(local_10,iVar1);
      } while (iVar1 != 0);
    }
  }
  return GENX_BAD_NAME;
}

Assistant:

static genxStatus checkNCName(genxWriter w, constUtf8 name)
{
  int c;

  if (name == NULL || *name == 0)
    return GENX_BAD_NAME;

  c = genxNextUnicodeChar(&name);
  if (!isLetter(w, c) && c != ':' && c != '_')
    return GENX_BAD_NAME;

  while (*name)
  {
    c = genxNextUnicodeChar(&name);
    if (c == -1)
      return GENX_BAD_UTF8;
    if (!isNameChar(w, c))
      return GENX_BAD_NAME;
  }
  return GENX_SUCCESS;
}